

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

Abc_Cex_t * Cec3_ManDeriveCex(Gia_Man_t *p,int iOut,int iPat)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  Gia_Obj_t *pObj;
  word *p_00;
  bool bVar3;
  int local_30;
  int local_2c;
  int Id;
  int i;
  Abc_Cex_t *pCex;
  int iPat_local;
  int iOut_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCiNum(p);
  pAVar2 = Abc_CexAlloc(0,iVar1,1);
  pAVar2->iPo = iOut;
  if (iPat != -1) {
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar3 = false;
      if (local_2c < iVar1) {
        pObj = Gia_ManCi(p,local_2c);
        local_30 = Gia_ObjId(p,pObj);
        bVar3 = local_30 != 0;
      }
      if (!bVar3) break;
      p_00 = Cec3_ObjSim(p,local_30);
      iVar1 = Abc_InfoHasBit((uint *)p_00,iPat);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)(pAVar2 + 1),local_2c);
      }
      local_2c = local_2c + 1;
    }
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Cec3_ManDeriveCex( Gia_Man_t * p, int iOut, int iPat )
{
    Abc_Cex_t * pCex;
    int i, Id;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p), 1 );
    pCex->iPo = iOut;
    if ( iPat == -1 )
        return pCex;
    Gia_ManForEachCiId( p, Id, i )
        if ( Abc_InfoHasBit((unsigned *)Cec3_ObjSim(p, Id), iPat) )
            Abc_InfoSetBit( pCex->pData, i );
    return pCex;
}